

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

void __thiscall
spvtools::opt::analysis::Struct::Struct
          (Struct *this,
          vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
          *types)

{
  bool bVar1;
  int iVar2;
  reference ppTVar3;
  undefined4 extraout_var;
  Type *t;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  *__range2;
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  *types_local;
  Struct *this_local;
  
  Type::Type(&this->super_Type,kStruct);
  (this->super_Type)._vptr_Type = (_func_int **)&PTR__Struct_0082ae68;
  std::
  vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
  ::vector(&this->element_types_,types);
  std::
  map<unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
  ::map(&this->element_decorations_);
  __end2 = std::
           vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
           ::begin(types);
  t = (Type *)std::
              vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
              ::end(types);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_spvtools::opt::analysis::Type_*const_*,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>
                                *)&t);
    if (!bVar1) {
      return;
    }
    ppTVar3 = __gnu_cxx::
              __normal_iterator<const_spvtools::opt::analysis::Type_*const_*,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>
              ::operator*(&__end2);
    iVar2 = (*(*ppTVar3)->_vptr_Type[6])();
    if (CONCAT44(extraout_var,iVar2) != 0) break;
    __gnu_cxx::
    __normal_iterator<const_spvtools::opt::analysis::Type_*const_*,_std::vector<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>_>
    ::operator++(&__end2);
  }
  __assert_fail("!t->AsVoid()",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/types.cpp"
                ,0x1ec,"spvtools::opt::analysis::Struct::Struct(const std::vector<const Type *> &)")
  ;
}

Assistant:

Struct::Struct(const std::vector<const Type*>& types)
    : Type(kStruct), element_types_(types) {
  for (const auto* t : types) {
    (void)t;
    assert(!t->AsVoid());
  }
}